

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

string * anon_unknown.dwarf_1391874::ToNativePath(string *__return_storage_ptr__,string *path)

{
  string local_30;
  
  cmSystemTools::ConvertToOutputPath(&local_30,path);
  if (((local_30._M_string_length < 2) || (*local_30._M_dataplus._M_p != '\"')) ||
     (local_30._M_dataplus._M_p[local_30._M_string_length - 1] != '\"')) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_30._M_dataplus._M_p,
               local_30._M_dataplus._M_p + local_30._M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_30);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToNativePath(const std::string& path)
{
  const auto& outPath = cmSystemTools::ConvertToOutputPath(path);
  if (outPath.size() > 1 && outPath.front() == '\"' &&
      outPath.back() == '\"') {
    return outPath.substr(1, outPath.size() - 2);
  }
  return outPath;
}